

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O2

void __thiscall
glslang::TIntermediate::insertSpirvExecutionModeId
          (TIntermediate *this,int executionMode,TIntermAggregate *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  int iVar3;
  TSpirvExecutionMode *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
  *this_01;
  undefined4 in_register_00000034;
  undefined8 *puVar4;
  int executionMode_local;
  TIntermediate *local_60;
  TIntermTyped *extraOperand;
  TVector<const_glslang::TIntermTyped_*> extraOperands;
  
  executionMode_local = executionMode;
  if (this->spirvExecutionMode == (TSpirvExecutionMode *)0x0) {
    this_00 = (TSpirvExecutionMode *)
              TSpirvExecutionMode::operator_new
                        ((TSpirvExecutionMode *)0x70,CONCAT44(in_register_00000034,executionMode));
    TSpirvExecutionMode::TSpirvExecutionMode(this_00);
    this->spirvExecutionMode = this_00;
  }
  local_60 = this;
  if (args == (TIntermAggregate *)0x0) {
    __assert_fail("args",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SpirvIntrinsics.cpp"
                  ,0x8b,
                  "void glslang::TIntermediate::insertSpirvExecutionModeId(int, const TIntermAggregate *)"
                 );
  }
  TVector<const_glslang::TIntermTyped_*>::TVector
            ((TVector<const_glslang::TIntermTyped_*> *)
             &extraOperands.
              super_vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
            );
  iVar3 = (*(args->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x33])(args);
  puVar4 = *(undefined8 **)(CONCAT44(extraout_var,iVar3) + 8);
  puVar1 = *(undefined8 **)(CONCAT44(extraout_var,iVar3) + 0x10);
  while( true ) {
    if (puVar4 == puVar1) {
      this_01 = &std::
                 map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                 ::operator[](&(local_60->spirvExecutionMode->modeIds).
                               super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                              ,&executionMode_local)->
                 super_vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
      ;
      std::
      vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
      ::operator=(this_01,&extraOperands.
                           super_vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
                 );
      return;
    }
    extraOperand = (TIntermTyped *)(**(code **)(*(long *)*puVar4 + 0x18))();
    if (extraOperand == (TIntermTyped *)0x0) break;
    iVar3 = (*(extraOperand->super_TIntermNode)._vptr_TIntermNode[0x21])(extraOperand);
    uVar2 = *(ulong *)(CONCAT44(extraout_var_00,iVar3) + 8);
    if ((uVar2 & 0x100000000) == 0 && (uVar2 & 0x10000007f) != 2) break;
    std::
    vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>::
    push_back(&extraOperands.
               super_vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
              ,&extraOperand);
    puVar4 = puVar4 + 1;
  }
  __assert_fail("extraOperand != nullptr && extraOperand->getQualifier().isConstant()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SpirvIntrinsics.cpp"
                ,0x90,
                "void glslang::TIntermediate::insertSpirvExecutionModeId(int, const TIntermAggregate *)"
               );
}

Assistant:

void TIntermediate::insertSpirvExecutionModeId(int executionMode, const TIntermAggregate* args)
{
    if (!spirvExecutionMode)
        spirvExecutionMode = new TSpirvExecutionMode;

    assert(args);
    TVector<const TIntermTyped*> extraOperands;

    for (auto arg : args->getSequence()) {
        auto extraOperand = arg->getAsTyped();
        assert(extraOperand != nullptr && extraOperand->getQualifier().isConstant());
        extraOperands.push_back(extraOperand);
    }
    spirvExecutionMode->modeIds[executionMode] = extraOperands;
}